

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1M1Q<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_6,_1,_0,_6,_1> *l1,Matrix<float,_6,_1,_0,_6,_1> *l2
          )

{
  float *pfVar1;
  iterator __position;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *this;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar4;
  undefined8 *puVar5;
  long lVar6;
  assign_op<float,_float> *paVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar11;
  undefined1 auVar10 [16];
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float fVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Matrix<float,_3,_1,_0,_3,_1> ey;
  Matrix<float,_3,_1,_0,_3,_1> ex;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *trans;
  Matrix<float,_3,_3,_0,_3,_3> U2;
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_4,_4,_0,_4,_4> TU_B;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  SrcEvaluatorType srcEvaluator_4;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_3,_3,_0,_3,_3> U1;
  DstEvaluatorType dstEvaluator_4;
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  assign_op<float,_float> local_5c9;
  Matrix<float,_3,_1,_0,_3,_1> local_5c8;
  Matrix<float,_3,_1,_0,_3,_1> local_5b8;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  float fStack_590;
  float fStack_58c;
  undefined8 local_588;
  float fStack_580;
  float fStack_57c;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_578;
  float local_56c;
  float fStack_568;
  float local_564;
  float local_560;
  float local_55c;
  float local_558;
  float local_554;
  float local_550;
  float local_54c;
  float local_548;
  undefined8 uStack_544;
  undefined8 uStack_53c;
  float fStack_534;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  float fStack_518;
  float fStack_514;
  float local_510;
  float local_50c;
  float local_508;
  undefined8 uStack_504;
  undefined8 uStack_4fc;
  float fStack_4f4;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  float fStack_4d8;
  float fStack_4d4;
  float local_4d0;
  float local_4cc;
  undefined1 local_4c8 [4];
  float fStack_4c4;
  undefined8 uStack_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  undefined8 local_49c;
  undefined8 uStack_494;
  float local_48c;
  undefined1 local_488 [4];
  float fStack_484;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  undefined8 local_45c;
  undefined8 uStack_454;
  float local_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [12];
  float fStack_42c;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [28];
  float fStack_3dc;
  variable_if_dynamic<long,__1> local_3d8;
  variable_if_dynamic<long,__1> vStack_3d0;
  Index local_3c8;
  float local_3c0;
  float local_3bc [22];
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  plainobjectbase_evaluator_data<float,_3> local_280;
  undefined1 local_278 [28];
  float fStack_25c;
  float local_258 [28];
  undefined1 local_1e8 [12];
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  Matrix<float,_3,_1,_0,_3,_1> local_1a8;
  Matrix<float,_3,_1,_0,_3,_1> local_198;
  undefined1 local_18c [8];
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  DstEvaluatorType local_168;
  float local_158;
  undefined8 uStack_154;
  Matrix<float,_3,_1,_0,_3,_1> MStack_14c;
  float fStack_140;
  float fStack_13c;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 local_128;
  float fStack_120;
  undefined8 uStack_11c;
  undefined4 uStack_114;
  float fStack_110;
  float local_10c;
  float fStack_108;
  float local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined4 local_e4;
  float fStack_e0;
  float fStack_dc;
  float fStack_d8;
  float local_d4;
  undefined4 uStack_d0;
  undefined4 local_cc;
  float local_c8;
  undefined8 uStack_c4;
  Matrix<float,_3,_1,_0,_3,_1> MStack_bc;
  float fStack_b0;
  float fStack_ac;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  float fStack_90;
  undefined8 uStack_8c;
  undefined4 uStack_84;
  float fStack_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float local_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined1 auVar17 [16];
  
  fVar15 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar24 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar11 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar12 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  local_508 = 1.0;
  uStack_504 = 0;
  uStack_4fc = 0;
  fStack_4f4 = 1.0;
  uStack_4f0 = 0;
  uStack_4e8 = 0;
  local_4e0 = 0x3f800000;
  local_4cc = 1.0;
  local_548 = 1.0;
  uStack_544 = 0;
  uStack_53c = 0;
  fStack_534 = 1.0;
  uStack_530 = 0;
  uStack_528 = 0;
  local_520 = 0x3f800000;
  local_50c = 1.0;
  auVar22._0_8_ =
       *(undefined8 *)
        ((l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
        1);
  auVar26._0_8_ =
       *(undefined8 *)
        ((l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
        4);
  fVar19 = (float)auVar22._0_8_;
  fVar28 = (float)((ulong)auVar22._0_8_ >> 0x20);
  fVar14 = (float)auVar26._0_8_;
  fVar16 = (float)((ulong)auVar26._0_8_ >> 0x20);
  fStack_4d8 = fVar16 * fVar19 - fVar28 * fVar14;
  fStack_4d4 = fVar24 * fVar28 - fVar15 * fVar16;
  local_4d0 = fVar14 * fVar15 - fVar24 * fVar19;
  fVar24 = fVar28 * local_4d0 + fStack_4d4 * fVar19 + fVar15 * fStack_4d8;
  fStack_4d8 = fStack_4d8 - fVar24 * fVar15;
  fStack_4d4 = fStack_4d4 - fVar24 * fVar19;
  local_4d0 = local_4d0 - fVar28 * fVar24;
  auVar22._0_8_ =
       *(undefined8 *)
        ((l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
        1);
  auVar26._0_8_ =
       *(undefined8 *)
        ((l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
        4);
  fVar15 = (float)auVar26._0_8_;
  fVar16 = (float)((ulong)auVar26._0_8_ >> 0x20);
  fVar24 = (float)auVar22._0_8_;
  fVar14 = (float)((ulong)auVar22._0_8_ >> 0x20);
  local_448 = fVar16 * fVar24 - fVar14 * fVar15;
  fStack_444 = fVar12 * fVar14 - fVar11 * fVar16;
  local_510 = fVar15 * fVar11 - fVar12 * fVar24;
  fVar15 = fVar14 * local_510 + fStack_444 * fVar24 + fVar11 * local_448;
  local_448 = local_448 - fVar15 * fVar11;
  fStack_444 = fStack_444 - fVar15 * fVar24;
  fStack_440 = (fVar16 * 0.0 - fVar14 * 0.0) - fVar14 * 0.0;
  fStack_43c = (fVar16 * 0.0 - fVar14 * 0.0) - fVar14 * fVar14;
  local_510 = local_510 - fVar14 * fVar15;
  local_5a8 = CONCAT44(fVar16,local_510);
  uStack_5a0 = 0;
  local_158 = 1.0;
  uStack_154 = 0;
  MStack_14c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  MStack_14c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  MStack_14c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  fStack_140 = 0.0;
  fStack_13c = 1.0;
  uStack_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  fStack_120 = 1.0;
  uStack_11c = 0;
  uStack_114 = 0;
  fStack_110 = 0.0;
  local_10c = 0.0;
  fStack_108 = 0.0;
  local_104 = 1.0;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  local_e8 = 0x3f800000;
  local_e4 = 0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  fStack_d8 = 0.0;
  local_d4 = 0.0;
  uStack_d0 = 0;
  local_cc = 0x3f800000;
  local_c8 = 1.0;
  uStack_c4 = 0;
  MStack_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  MStack_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  MStack_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  fStack_b0 = 0.0;
  fStack_ac = 1.0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  fStack_90 = 1.0;
  uStack_8c = 0;
  uStack_84 = 0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  fStack_78 = 0.0;
  fStack_74 = 1.0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  local_58 = 0x3f800000;
  local_54 = 0;
  fStack_50 = 0.0;
  fStack_4c = 0.0;
  fStack_48 = 0.0;
  local_44 = 0.0;
  uStack_40 = 0;
  local_3c = 0x3f800000;
  local_598 = l2;
  local_588 = l1;
  local_578 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  local_198.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_4d0;
  local_198.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       fStack_4d8;
  local_198.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       fStack_4d4;
  fStack_518 = local_448;
  fStack_514 = fStack_444;
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_3f8,&local_198);
  local_278._8_4_ = 4.2039e-45;
  local_278._12_4_ = 0.0;
  local_278._16_4_ = 4.2039e-45;
  local_278._20_4_ = 0.0;
  unique0x00005300 = &local_158;
  local_258[0] = 4.2039e-45;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  local_258[3] = 0.0;
  local_258[4] = 8.40779e-45;
  local_258[5] = 0.0;
  uStack_480 = (SrcEvaluatorType *)local_4c8;
  uStack_478 = (float *)local_438;
  uStack_470 = (DstXprType *)local_278;
  local_1e8._0_8_ = &MStack_14c;
  local_278._0_8_ = &MStack_14c;
  uStack_4c0 = (float *)local_3f8;
  _local_488 = (DstEvaluatorType *)local_1e8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_488);
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       fStack_444;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_448;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (float)local_5a8;
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_3f8,&local_1a8);
  local_278._8_4_ = 4.2039e-45;
  local_278._12_4_ = 0.0;
  local_278._16_4_ = 4.2039e-45;
  local_278._20_4_ = 0.0;
  unique0x00005300 = &local_c8;
  local_258[0] = 4.2039e-45;
  local_258[1] = 0.0;
  local_258[2] = 0.0;
  local_258[3] = 0.0;
  local_258[4] = 8.40779e-45;
  local_258[5] = 0.0;
  uStack_4c0 = (float *)local_3f8;
  uStack_480 = (SrcEvaluatorType *)local_4c8;
  uStack_470 = (DstXprType *)local_278;
  local_1e8._0_8_ = &MStack_bc;
  local_278._0_8_ = &MStack_bc;
  uStack_478 = (float *)local_438;
  _local_488 = (DstEvaluatorType *)local_1e8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_488);
  local_298 = (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
              m_data.array[0];
  fStack_294 = (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[1];
  fStack_290 = (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[2];
  fStack_28c = (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[3];
  local_308 = *(undefined8 *)
               ((local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                m_data.array + 1);
  uStack_300 = *(undefined8 *)
                ((local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                 m_data.array + 3);
  pfVar1 = (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data
           .array + 2;
  fStack_33c = *pfVar1;
  local_5a8 = *(undefined8 *)pfVar1;
  uStack_5a0._0_4_ =
       (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
       array[4];
  uStack_5a0._4_4_ =
       (local_588->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
       array[5];
  local_2b8 = local_298 * local_158;
  fStack_2b4 = local_298 * (float)uStack_154;
  fStack_2b0 = local_298 * uStack_154._4_4_;
  fStack_2ac = local_298 *
               MStack_14c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
  local_338 = fStack_140;
  fStack_334 = fStack_13c;
  uStack_330 = uStack_138;
  local_2f8 = fStack_110;
  fStack_2f4 = local_10c;
  fStack_2f0 = fStack_108;
  fStack_2ec = local_104;
  local_2c8 = fStack_e0;
  fStack_2c4 = fStack_dc;
  fStack_2c0 = fStack_d8;
  fStack_2bc = local_d4;
  local_348 = fStack_33c * (float)local_128;
  fStack_344 = fStack_33c * local_128._4_4_;
  fStack_340 = fStack_33c * fStack_120;
  fStack_33c = fStack_33c * (float)uStack_11c;
  local_2d8 = (float)uStack_5a0 * (float)uStack_f8;
  fStack_2d4 = (float)uStack_5a0 * uStack_f8._4_4_;
  fStack_2d0 = (float)uStack_5a0 * (float)local_f0;
  fStack_2cc = (float)uStack_5a0 * local_f0._4_4_;
  local_448 = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
              m_data.array[0];
  fStack_444 = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[1];
  fStack_440 = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[2];
  fStack_43c = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[3];
  local_2e8 = *(undefined8 *)
               ((local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                m_data.array + 1);
  uStack_2e0 = *(undefined8 *)
                ((local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                 m_data.array + 3);
  local_2a8 = local_448 * local_c8;
  fStack_2a4 = local_448 * (float)uStack_c4;
  fStack_2a0 = local_448 * uStack_c4._4_4_;
  fStack_29c = local_448 *
               MStack_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
  pfVar1 = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data
           .array + 2;
  fStack_31c = *pfVar1;
  local_588 = *(Matrix<float,_6,_1,_0,_6,_1> **)pfVar1;
  fStack_580 = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[4];
  fStack_57c = (local_598->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[5];
  local_318 = fStack_b0;
  fStack_314 = fStack_ac;
  uStack_310 = uStack_a8;
  local_328 = fStack_31c * (float)local_98;
  fStack_324 = fStack_31c * local_98._4_4_;
  fStack_320 = fStack_31c * fStack_90;
  fStack_31c = fStack_31c * (float)uStack_8c;
  local_598._0_4_ = fStack_580 * (float)uStack_68;
  local_598._4_4_ = fStack_580 * uStack_68._4_4_;
  fStack_590 = fStack_580 * (float)local_60;
  fStack_58c = fStack_580 * local_60._4_4_;
  local_278._0_8_ = &local_5b8;
  local_278._8_4_ = 0.0;
  local_278._12_4_ = 0.0;
  local_278._16_4_ = 1.4013e-45;
  local_278._20_4_ = 0.0;
  local_278._24_4_ = 1.4013e-45;
  fStack_25c = 0.0;
  local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_3f8._0_4_ = 0.0;
  local_3bc[0x15] = fStack_80;
  fStack_364 = fStack_7c;
  fStack_360 = fStack_78;
  fStack_35c = fStack_74;
  local_358 = fStack_50;
  fStack_354 = fStack_4c;
  fStack_350 = fStack_48;
  fStack_34c = local_44;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_278,
                      (Scalar *)local_3f8);
  local_488 = (undefined1  [4])0x0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
            (pCVar4,(Scalar *)local_488);
  if ((CONCAT44(fStack_25c,local_278._24_4_) + CONCAT44(local_278._12_4_,local_278._8_4_) == 3) &&
     (CONCAT44(local_278._20_4_,local_278._16_4_) == 1)) {
    local_278._0_8_ = &local_5c8;
    local_278._8_4_ = 0.0;
    local_278._12_4_ = 0.0;
    local_278._16_4_ = 1.4013e-45;
    local_278._20_4_ = 0.0;
    local_278._24_4_ = 1.4013e-45;
    fStack_25c = 0.0;
    local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_3f8._0_4_ = 1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_278,
                        (Scalar *)local_3f8);
    local_488 = (undefined1  [4])0x0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
              (pCVar4,(Scalar *)local_488);
    if ((CONCAT44(fStack_25c,local_278._24_4_) + CONCAT44(local_278._12_4_,local_278._8_4_) == 3) &&
       (CONCAT44(local_278._20_4_,local_278._16_4_) == 1)) {
      local_184 = uStack_5a0._4_4_ * local_2c8 +
                  local_2d8 +
                  fStack_28c * local_2f8 + local_2b8 + local_338 * (float)local_308 + local_348;
      local_178 = uStack_5a0._4_4_ * fStack_2c4 +
                  fStack_2d4 +
                  fStack_28c * fStack_2f4 + fStack_2b4 + fStack_334 * (float)local_308 + fStack_344;
      local_16c = uStack_5a0._4_4_ * fStack_2c0 +
                  fStack_2d0 +
                  fStack_28c * fStack_2f0 +
                  fStack_2b0 + (float)uStack_330 * (float)local_308 + fStack_340;
      fVar15 = uStack_5a0._4_4_ * fStack_2bc +
               fStack_2cc +
               fStack_28c * fStack_2ec +
               fStack_2ac + uStack_330._4_4_ * (float)local_308 + fStack_33c;
      auVar8._0_4_ = local_318 * (float)local_2e8;
      auVar8._4_4_ = fStack_314 * (float)local_2e8;
      auVar8._8_4_ = (float)uStack_310 * (float)local_2e8;
      auVar8._12_4_ = uStack_310._4_4_ * (float)local_2e8;
      fStack_580 = fStack_590 + fStack_43c * fStack_360 + fStack_2a0 + auVar8._8_4_ + fStack_320;
      local_588._0_4_ =
           fStack_57c * local_358 +
           (float)local_598 + fStack_43c * local_3bc[0x15] + local_2a8 + auVar8._0_4_ + local_328;
      fStack_590 = fStack_57c * fStack_354 +
                   local_598._4_4_ +
                   fStack_43c * fStack_364 + fStack_2a4 + auVar8._4_4_ + fStack_324;
      fStack_580 = fStack_57c * fStack_350 + fStack_580;
      fStack_57c = fStack_57c * fStack_34c +
                   fStack_58c + fStack_43c * fStack_35c + fStack_29c + auVar8._12_4_ + fStack_31c;
      auVar3._4_8_ = auVar8._8_8_;
      auVar3._0_4_ = fStack_590;
      auVar9._0_8_ = auVar3._0_8_ << 0x20;
      auVar9._8_4_ = fStack_580;
      auVar9._12_4_ = fStack_57c;
      local_5a8 = auVar9._8_8_;
      uStack_5a0 = CONCAT44(fStack_57c,fStack_580);
      fVar16 = local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * local_184 -
               local_16c *
               local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      fVar19 = local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_178 -
               local_184 *
               local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      auVar17._0_8_ = CONCAT44(fVar19,fVar16);
      auVar17._8_4_ = local_16c * 0.0 - local_16c * 0.0;
      auVar17._12_4_ =
           local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * fVar15 - fVar15 * 0.0;
      fVar12 = local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * local_184 -
               local_16c *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      fVar14 = local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_178 -
               local_184 *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      auVar22._0_8_ = CONCAT44(fVar14,fVar12);
      auVar22._8_4_ = local_16c * 0.0 - local_16c * 0.0;
      auVar22._12_4_ =
           local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * fVar15 - fVar15 * 0.0;
      local_18c._0_4_ =
           local_16c *
           local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] -
           local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * local_178;
      fVar15 = local_16c *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] -
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * local_178;
      fVar24 = local_16c * 0.0 - local_178 * 0.0;
      fVar11 = local_16c * 0.0 - local_178 * 0.0;
      auVar25._0_4_ = (float)local_18c._0_4_ * (float)local_18c._0_4_;
      auVar25._4_4_ = fVar15 * fVar15;
      auVar25._8_4_ = fVar24 * fVar24;
      auVar25._12_4_ = fVar11 * fVar11;
      auVar20._0_4_ = fVar16 * fVar16 + fVar19 * fVar19 + auVar25._0_4_;
      auVar20._4_4_ = fVar12 * fVar12 + fVar14 * fVar14 + auVar25._4_4_;
      auVar20._8_4_ = fVar19 * fVar19 + auVar17._8_4_ * auVar17._8_4_ + auVar25._8_4_;
      auVar20._12_4_ = fVar14 * fVar14 + auVar17._12_4_ * auVar17._12_4_ + auVar25._12_4_;
      auVar26 = sqrtps(auVar25,auVar20);
      auVar27._0_4_ = auVar26._0_4_;
      fVar24 = auVar26._4_4_;
      if (auVar27._0_4_ <= fVar24) {
        local_18c._0_4_ = fVar15;
        if (0.0 < auVar20._4_4_) {
          local_18c._0_4_ = fVar15 / fVar24;
          auVar2._4_4_ = fVar24;
          auVar2._0_4_ = fVar24;
          auVar2._8_4_ = fVar24;
          auVar2._12_4_ = fVar24;
          auVar26 = divps(auVar22,auVar2);
          auVar22._0_8_ = auVar26._0_8_;
        }
      }
      else {
        auVar22._0_8_ = auVar17._0_8_;
        if (0.0 < auVar20._0_4_) {
          local_18c._0_4_ = (float)local_18c._0_4_ / auVar27._0_4_;
          auVar27._4_4_ = auVar27._0_4_;
          auVar27._8_4_ = auVar27._0_4_;
          auVar27._12_4_ = auVar27._0_4_;
          auVar26 = divps(auVar17,auVar27);
          auVar22._0_8_ = auVar26._0_8_;
        }
      }
      puVar5 = (undefined8 *)local_18c;
      local_180 = (float)auVar22._0_8_;
      local_174 = (float)((ulong)auVar22._0_8_ >> 0x20);
      local_18c._4_4_ = local_178 * local_174 - local_180 * local_16c;
      local_17c = local_16c * (float)local_18c._0_4_ - local_174 * local_184;
      local_170 = local_180 * local_184 - (float)local_18c._0_4_ * local_178;
      local_488 = (undefined1  [4])0x3f800000;
      fStack_484 = 0.0;
      uStack_480._0_4_ = 0.0;
      uStack_480._4_4_ = 0.0;
      uStack_478._0_4_ = 0.0;
      uStack_478._4_4_ = 1.0;
      uStack_470 = (DstXprType *)0x0;
      uStack_468 = 0;
      local_460 = 1.0;
      local_45c = 0;
      uStack_454 = 0;
      local_44c = 1.0;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&uStack_480 + lVar6) = *(undefined4 *)(puVar5 + 1);
        *(undefined8 *)(local_488 + lVar6) = *puVar5;
        puVar5 = (undefined8 *)((long)puVar5 + 0xc);
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      local_278._0_4_ = 1.0;
      local_278._4_4_ = 0.0;
      local_278._8_4_ = 0.0;
      local_278._12_4_ = 0.0;
      local_278._16_4_ = 0.0;
      local_278._20_4_ = 0.0;
      local_278._24_4_ = 0.0;
      fStack_25c = 1.0;
      local_258[0] = 0.0;
      local_258[1] = 0.0;
      local_258[2] = 0.0;
      local_258[3] = 0.0;
      local_258[4] = 0.0;
      local_258[5] = 0.0;
      local_258[6] = 1.0;
      local_258[7] = 0.0;
      local_258[8] = 0.0;
      local_258[9] = 0.0;
      local_258[10] = 0.0;
      local_258[0xb] = 0.0;
      local_258[0xc] = 0.0;
      local_258[0xd] = 1.0;
      local_258[0xe] = 0.0;
      local_258[0xf] = 0.0;
      local_258[0x10] = 0.0;
      local_258[0x11] = 0.0;
      local_258[0x12] = 0.0;
      local_258[0x13] = 0.0;
      local_258[0x14] = 1.0;
      local_258[0x15] = 0.0;
      local_258[0x16] = 0.0;
      local_258[0x17] = 0.0;
      local_258[0x18] = 0.0;
      local_258[0x19] = 0.0;
      local_258[0x1a] = 0.0;
      local_258[0x1b] = 1.0;
      local_3f8._8_4_ = 4.2039e-45;
      local_3f8._12_4_ = 0.0;
      local_3f8._16_4_ = 4.2039e-45;
      local_3f8._20_4_ = 0.0;
      local_3d8.m_value = 0;
      vStack_3d0.m_value = 0;
      local_3c8 = 6;
      local_438._0_8_ = local_18c;
      paVar7 = (assign_op<float,_float> *)&local_56c;
      fStack_58c = fStack_590;
      uStack_4b0 = (DstXprType *)local_3f8;
      local_1e8._0_8_ = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_278;
      local_588._4_4_ = fStack_590;
      local_598._0_4_ = fStack_590;
      local_598._4_4_ = fStack_590;
      local_3f8._0_8_ = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_278;
      _local_4c8 = (DstEvaluatorType *)local_1e8;
      uStack_4b8 = paVar7;
      uStack_4c0 = (float *)local_438;
      unique0x10002db5 = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_278;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_4c8);
      local_3f8._8_4_ = 4.2039e-45;
      local_3f8._12_4_ = 0.0;
      local_3f8._16_4_ = 4.2039e-45;
      local_3f8._20_4_ = 0.0;
      unique0x00005300 = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_278;
      local_3d8.m_value = 3;
      vStack_3d0.m_value = 3;
      local_3c8 = 6;
      local_438._0_8_ = local_18c;
      uStack_4c0 = (float *)local_438;
      uStack_4b0 = (DstXprType *)local_3f8;
      local_1e8._0_8_ = local_258 + 0xd;
      local_3f8._0_8_ = local_258 + 0xd;
      _local_4c8 = (DstEvaluatorType *)local_1e8;
      uStack_4b8 = paVar7;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_4c8);
      fVar16 = local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * (float)local_588 -
               fStack_580 *
               local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      fVar19 = local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_588._4_4_ -
               (float)local_588 *
               local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      auVar10._0_8_ = CONCAT44(fVar19,fVar16);
      auVar10._8_4_ = fStack_580 * 0.0 - fStack_580 * 0.0;
      auVar10._12_4_ =
           local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * fStack_57c - fStack_57c * 0.0;
      fVar12 = local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * (float)local_588 -
               fStack_580 *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      fVar14 = local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_588._4_4_ -
               (float)local_588 *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      auVar26._0_8_ = CONCAT44(fVar14,fVar12);
      auVar26._8_4_ = fStack_580 * 0.0 - fStack_580 * 0.0;
      auVar26._12_4_ =
           local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * fStack_57c - fStack_57c * 0.0;
      fVar19 = fVar19 * fVar19;
      fVar14 = fVar14 * fVar14;
      local_56c = fStack_580 *
                  local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] -
                  (float)local_598 *
                  local_5c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
      fVar15 = fStack_580 *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] -
               local_598._4_4_ *
               local_5b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
      fVar24 = fStack_580 * 0.0 - fStack_590 * 0.0;
      fVar11 = fStack_580 * 0.0 - fStack_58c * 0.0;
      auVar21._4_4_ = fVar14;
      auVar21._0_4_ = fVar19;
      auVar21._8_4_ = auVar10._8_4_ * auVar10._8_4_;
      auVar21._12_4_ = auVar10._12_4_ * auVar10._12_4_;
      auVar13._0_4_ = fVar16 * fVar16 + fVar19 + local_56c * local_56c;
      auVar13._4_4_ = fVar12 * fVar12 + fVar14 + fVar15 * fVar15;
      auVar13._8_4_ = fVar19 + auVar10._8_4_ * auVar10._8_4_ + fVar24 * fVar24;
      auVar13._12_4_ = fVar14 + auVar10._12_4_ * auVar10._12_4_ + fVar11 * fVar11;
      auVar22 = sqrtps(auVar21,auVar13);
      auVar23._0_4_ = auVar22._0_4_;
      fVar24 = auVar22._4_4_;
      auVar18._4_4_ = fVar24;
      auVar18._0_4_ = fVar24;
      auVar18._8_4_ = fVar24;
      auVar18._12_4_ = fVar24;
      if (auVar23._0_4_ <= fVar24) {
        local_56c = fVar15;
        if (0.0 < auVar13._4_4_) {
          local_56c = fVar15 / fVar24;
          auVar26 = divps(auVar26,auVar18);
        }
      }
      else {
        auVar26._0_8_ = auVar10._0_8_;
        if (0.0 < auVar13._0_4_) {
          local_56c = local_56c / auVar23._0_4_;
          auVar23._4_4_ = auVar23._0_4_;
          auVar23._8_4_ = auVar23._0_4_;
          auVar23._12_4_ = auVar23._0_4_;
          auVar26 = divps(auVar10,auVar23);
        }
      }
      local_560 = (float)auVar26._0_8_;
      local_554 = (float)((ulong)auVar26._0_8_ >> 0x20);
      fStack_568 = (float)local_598 * local_554 - local_560 * (float)local_5a8;
      local_55c = (float)local_5a8 * local_56c - local_554 * (float)local_588;
      local_550 = local_560 * (float)local_588 - local_56c * (float)local_598;
      local_564 = (float)local_588;
      local_558 = (float)local_598;
      local_54c = (float)local_5a8;
      local_4c8 = (undefined1  [4])0x3f800000;
      fStack_4c4 = 0.0;
      uStack_4c0._0_4_ = 0.0;
      uStack_4c0._4_4_ = 0.0;
      uStack_4b8._0_4_ = 0.0;
      uStack_4b8._4_4_ = 1.0;
      uStack_4b0 = (DstXprType *)0x0;
      uStack_4a8 = 0;
      local_4a0 = 1.0;
      local_49c = 0;
      uStack_494 = 0;
      local_48c = 1.0;
      lVar6 = 0;
      do {
        *(float *)((long)&uStack_4c0 + lVar6) = *(float *)(paVar7 + 8);
        *(undefined8 *)(local_4c8 + lVar6) = *(undefined8 *)paVar7;
        paVar7 = paVar7 + 0xc;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      local_3f8._0_4_ = 1.0;
      local_3f8._4_4_ = 0.0;
      local_3f8._8_4_ = 0.0;
      local_3f8._12_4_ = 0.0;
      local_3f8._16_4_ = 0.0;
      local_3f8._20_4_ = 0.0;
      local_3f8._24_4_ = 0.0;
      fStack_3dc = 1.0;
      local_3d8.m_value = 0;
      vStack_3d0.m_value = 0;
      local_3c8 = 0;
      local_3c0 = 1.0;
      local_3bc[0] = 0.0;
      local_3bc[1] = 0.0;
      local_3bc[2] = 0.0;
      local_3bc[3] = 0.0;
      local_3bc[4] = 0.0;
      local_3bc[5] = 0.0;
      local_3bc[6] = 1.0;
      local_3bc[7] = 0.0;
      local_3bc[8] = 0.0;
      local_3bc[9] = 0.0;
      local_3bc[10] = 0.0;
      local_3bc[0xb] = 0.0;
      local_3bc[0xc] = 0.0;
      local_3bc[0xd] = 1.0;
      local_3bc[0xe] = 0.0;
      local_3bc[0xf] = 0.0;
      local_3bc[0x10] = 0.0;
      local_3bc[0x11] = 0.0;
      local_3bc[0x12] = 0.0;
      local_3bc[0x13] = 0.0;
      local_3bc[0x14] = 1.0;
      local_1e8._0_8_ = local_3f8;
      stack0xfffffffffffffe20 = 3;
      local_1d8 = 3;
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_1b8 = 6;
      local_280.data = &local_56c;
      local_428 = &local_5c9;
      uStack_420 = (DstXprType *)local_1e8;
      local_438._0_8_ = &local_168;
      unique0x10002ce5 = &local_280;
      uStack_1d0 = (XprTypeNested)local_1e8._0_8_;
      local_168.super_block_evaluator<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_6,_6>_>
      .m_data = (PointerType)local_1e8._0_8_;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_438);
      stack0xfffffffffffffe20 = 3;
      local_1d8 = 3;
      uStack_1d0 = (XprTypeNested)local_3f8;
      local_1c8 = 3;
      uStack_1c0 = 3;
      local_1b8 = 6;
      local_280.data = &local_56c;
      local_428 = &local_5c9;
      uStack_420 = (DstXprType *)local_1e8;
      local_438._0_8_ = &local_168;
      unique0x10002ced = &local_280;
      local_1e8._0_8_ = local_3bc + 6;
      local_168.super_block_evaluator<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_6,_6>_>
      .m_data = local_3bc + 6;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_438);
      this = local_578;
      local_1e8._4_4_ =
           (float)uStack_4fc * (float)uStack_454 +
           uStack_504._4_4_ * uStack_468._4_4_ +
           (float)uStack_504 * uStack_478._4_4_ + local_508 * fStack_484;
      local_1e8._0_4_ =
           (float)uStack_4fc * local_45c._4_4_ +
           uStack_504._4_4_ * (float)uStack_468 +
           (float)uStack_504 * (float)uStack_478 + local_508 * (float)local_488;
      fStack_1dc = (float)uStack_4fc * local_44c +
                   uStack_504._4_4_ * (float)local_45c +
                   (float)uStack_504 * uStack_470._4_4_ + local_508 * uStack_480._4_4_;
      local_1e8._8_4_ =
           (float)uStack_4fc * uStack_454._4_4_ +
           uStack_504._4_4_ * local_460 +
           (float)uStack_504 * (float)uStack_470 + local_508 * (float)uStack_480;
      local_1d8._4_4_ =
           uStack_4f0._4_4_ * (float)uStack_454 +
           (float)uStack_4f0 * uStack_468._4_4_ +
           fStack_4f4 * uStack_478._4_4_ + uStack_4fc._4_4_ * fStack_484;
      local_1d8._0_4_ =
           uStack_4f0._4_4_ * local_45c._4_4_ +
           (float)uStack_4f0 * (float)uStack_468 +
           fStack_4f4 * (float)uStack_478 + uStack_4fc._4_4_ * (float)local_488;
      uStack_1d0 = (XprTypeNested)
                   CONCAT44(uStack_4f0._4_4_ * local_44c +
                            (float)uStack_4f0 * (float)local_45c +
                            fStack_4f4 * uStack_470._4_4_ + uStack_4fc._4_4_ * uStack_480._4_4_,
                            uStack_4f0._4_4_ * uStack_454._4_4_ +
                            (float)uStack_4f0 * local_460 +
                            fStack_4f4 * (float)uStack_470 + uStack_4fc._4_4_ * (float)uStack_480);
      local_1c8._4_4_ =
           local_4e0._4_4_ * (float)uStack_454 +
           (float)local_4e0 * uStack_468._4_4_ +
           uStack_4e8._4_4_ * uStack_478._4_4_ + (float)uStack_4e8 * fStack_484;
      local_1c8._0_4_ =
           local_4e0._4_4_ * local_45c._4_4_ +
           (float)local_4e0 * (float)uStack_468 +
           uStack_4e8._4_4_ * (float)uStack_478 + (float)uStack_4e8 * (float)local_488;
      uStack_1c0._4_4_ =
           local_4e0._4_4_ * local_44c +
           (float)local_4e0 * (float)local_45c +
           uStack_4e8._4_4_ * uStack_470._4_4_ + (float)uStack_4e8 * uStack_480._4_4_;
      uStack_1c0._0_4_ =
           local_4e0._4_4_ * uStack_454._4_4_ +
           (float)local_4e0 * local_460 +
           uStack_4e8._4_4_ * (float)uStack_470 + (float)uStack_4e8 * (float)uStack_480;
      fStack_1b0 = local_4cc * uStack_454._4_4_ +
                   local_4d0 * local_460 +
                   fStack_4d4 * (float)uStack_470 + fStack_4d8 * (float)uStack_480;
      fStack_1ac = local_4cc * local_44c +
                   local_4d0 * (float)local_45c +
                   fStack_4d4 * uStack_470._4_4_ + fStack_4d8 * uStack_480._4_4_;
      local_1b8 = CONCAT44(local_4cc * (float)uStack_454 +
                           local_4d0 * uStack_468._4_4_ +
                           fStack_4d4 * uStack_478._4_4_ + fStack_4d8 * fStack_484,
                           local_4cc * local_45c._4_4_ +
                           local_4d0 * (float)uStack_468 +
                           fStack_4d4 * (float)uStack_478 + fStack_4d8 * (float)local_488);
      local_438._4_4_ =
           (float)uStack_53c * (float)uStack_494 +
           uStack_544._4_4_ * uStack_4a8._4_4_ +
           (float)uStack_544 * uStack_4b8._4_4_ + local_548 * fStack_4c4;
      local_438._0_4_ =
           (float)uStack_53c * local_49c._4_4_ +
           uStack_544._4_4_ * (float)uStack_4a8 +
           (float)uStack_544 * (float)uStack_4b8 + local_548 * (float)local_4c8;
      stack0xfffffffffffffbd0 =
           (plainobjectbase_evaluator_data<float,_3> *)
           CONCAT44((float)uStack_53c * local_48c +
                    uStack_544._4_4_ * (float)local_49c +
                    (float)uStack_544 * uStack_4b0._4_4_ + local_548 * uStack_4c0._4_4_,
                    (float)uStack_53c * uStack_494._4_4_ +
                    uStack_544._4_4_ * local_4a0 +
                    (float)uStack_544 * (float)uStack_4b0 + local_548 * (float)uStack_4c0);
      local_428 = (assign_op<float,_float> *)
                  CONCAT44(uStack_530._4_4_ * (float)uStack_494 +
                           (float)uStack_530 * uStack_4a8._4_4_ +
                           fStack_534 * uStack_4b8._4_4_ + uStack_53c._4_4_ * fStack_4c4,
                           uStack_530._4_4_ * local_49c._4_4_ +
                           (float)uStack_530 * (float)uStack_4a8 +
                           fStack_534 * (float)uStack_4b8 + uStack_53c._4_4_ * (float)local_4c8);
      uStack_420 = (DstXprType *)
                   CONCAT44(uStack_530._4_4_ * local_48c +
                            (float)uStack_530 * (float)local_49c +
                            fStack_534 * uStack_4b0._4_4_ + uStack_53c._4_4_ * uStack_4c0._4_4_,
                            uStack_530._4_4_ * uStack_494._4_4_ +
                            (float)uStack_530 * local_4a0 +
                            fStack_534 * (float)uStack_4b0 + uStack_53c._4_4_ * (float)uStack_4c0);
      local_418 = local_520._4_4_ * local_49c._4_4_ +
                  (float)local_520 * (float)uStack_4a8 +
                  uStack_528._4_4_ * (float)uStack_4b8 + (float)uStack_528 * (float)local_4c8;
      fStack_414 = local_520._4_4_ * (float)uStack_494 +
                   (float)local_520 * uStack_4a8._4_4_ +
                   uStack_528._4_4_ * uStack_4b8._4_4_ + (float)uStack_528 * fStack_4c4;
      fStack_410 = local_520._4_4_ * uStack_494._4_4_ +
                   (float)local_520 * local_4a0 +
                   uStack_528._4_4_ * (float)uStack_4b0 + (float)uStack_528 * (float)uStack_4c0;
      fStack_40c = local_520._4_4_ * local_48c +
                   (float)local_520 * (float)local_49c +
                   uStack_528._4_4_ * uStack_4b0._4_4_ + (float)uStack_528 * uStack_4c0._4_4_;
      local_408 = local_50c * local_49c._4_4_ +
                  local_510 * (float)uStack_4a8 +
                  fStack_514 * (float)uStack_4b8 + fStack_518 * (float)local_4c8;
      fStack_404 = local_50c * (float)uStack_494 +
                   local_510 * uStack_4a8._4_4_ +
                   fStack_514 * uStack_4b8._4_4_ + fStack_518 * fStack_4c4;
      fStack_400 = local_50c * uStack_494._4_4_ +
                   local_510 * local_4a0 +
                   fStack_514 * (float)uStack_4b0 + fStack_518 * (float)uStack_4c0;
      fStack_3fc = local_50c * local_48c +
                   local_510 * (float)local_49c +
                   fStack_514 * uStack_4b0._4_4_ + fStack_518 * uStack_4c0._4_4_;
      *(undefined8 *)(local_578 + 0x10) = 0;
      *(undefined8 *)local_578 = 0;
      *(undefined8 *)(local_578 + 8) = 0;
      std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
      _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                (local_578,(iterator)0x0,(Matrix<float,_4,_4,_0,_4,_4> *)local_1e8);
      __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8);
      if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 0x10)) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  (this,__position,(Matrix<float,_4,_4,_0,_4,_4> *)local_438);
      }
      else {
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 0xc) = CONCAT44(fStack_404,local_408);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 0xe) = CONCAT44(fStack_3fc,fStack_400);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 8) = CONCAT44(fStack_414,local_418);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 10) = CONCAT44(fStack_40c,fStack_410);
        *(assign_op<float,_float> **)
         (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 4) = local_428;
        *(DstXprType **)
         (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 6) = uStack_420;
        *(undefined8 *)
         ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
         m_storage.m_data.array = local_438._0_8_;
        *(plainobjectbase_evaluator_data<float,_3> **)
         (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 2) = stack0xfffffffffffffbd0;
        *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8) = __position._M_current + 1;
      }
      return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)this;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}